

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FindInvalidDataProcess.cpp
# Opt level: O3

bool EpsilonCompare<aiQuatKey>(aiQuatKey *n,aiQuatKey *s,ai_real epsilon)

{
  if (((epsilon < ABS((n->mValue).x - (s->mValue).x)) &&
      (epsilon < ABS((n->mValue).y - (s->mValue).y))) &&
     (epsilon < ABS((n->mValue).z - (s->mValue).z))) {
    return epsilon < ABS((n->mValue).w - (s->mValue).w);
  }
  return false;
}

Assistant:

bool EpsilonCompare<aiQuatKey>(const aiQuatKey& n, const aiQuatKey& s, ai_real epsilon)   {
    return
        EpsilonCompare(n.mValue.x,s.mValue.x,epsilon) &&
        EpsilonCompare(n.mValue.y,s.mValue.y,epsilon) &&
        EpsilonCompare(n.mValue.z,s.mValue.z,epsilon) &&
        EpsilonCompare(n.mValue.w,s.mValue.w,epsilon);
}